

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

CURLcode Curl_xfer_send_shutdown(Curl_easy *data,_Bool *done)

{
  int sockindex;
  _Bool *done_local;
  Curl_easy *data_local;
  
  if ((data == (Curl_easy *)0x0) || (data->conn == (connectdata *)0x0)) {
    data_local._4_4_ = CURLE_FAILED_INIT;
  }
  else if (data->conn->writesockfd == -1) {
    data_local._4_4_ = CURLE_FAILED_INIT;
  }
  else {
    data_local._4_4_ =
         Curl_conn_shutdown(data,(uint)(data->conn->writesockfd == data->conn->sock[1]),done);
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_xfer_send_shutdown(struct Curl_easy *data, bool *done)
{
  int sockindex;

  if(!data || !data->conn)
    return CURLE_FAILED_INIT;
  if(data->conn->writesockfd == CURL_SOCKET_BAD)
    return CURLE_FAILED_INIT;
  sockindex = (data->conn->writesockfd == data->conn->sock[SECONDARYSOCKET]);
  return Curl_conn_shutdown(data, sockindex, done);
}